

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O1

void __thiscall QLocalSocketPrivate::_q_connectToSocket(QLocalSocketPrivate *this)

{
  QString *pQVar1;
  uint uVar2;
  int iVar3;
  QObject *this_00;
  undefined1 *puVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  int *piVar10;
  QSocketNotifier *this_01;
  QTimer *this_02;
  LocalSocketError error;
  undefined8 *puVar11;
  socklen_t __len;
  QArrayData *pQVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  sockaddr_un addr;
  QObject local_138 [8];
  QObject local_130 [8];
  QString local_128;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 *local_f8;
  QString local_e8;
  QArrayData *local_c8;
  char16_t *pcStack_c0;
  qsizetype qStack_b8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&> local_a8;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined4 uStack_7c;
  undefined2 local_78;
  undefined2 uStack_76;
  undefined4 uStack_74;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined4 uStack_6c;
  undefined2 local_68;
  undefined2 uStack_66;
  undefined4 uStack_64;
  undefined2 uStack_60;
  undefined2 uStack_5e;
  undefined4 uStack_5c;
  undefined2 local_58;
  undefined2 uStack_56;
  undefined4 uStack_54;
  undefined2 uStack_50;
  undefined2 uStack_4e;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  undefined2 uStack_48;
  undefined4 uStack_46;
  undefined8 uStack_42;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QObject **)&this->field_0x8;
  if ((*(long **)&this->field_0x48 != (long *)0x0) && (**(long **)&this->field_0x48 != 0)) {
    QBindingStorage::registerDependency_helper((QUntypedPropertyData *)&this->field_0x40);
  }
  uVar2 = (this->socketOptions).super_QPropertyData<QFlags<QLocalSocket::SocketOption>_>.val.
          super_QFlagsStorageHelper<QLocalSocket::SocketOption,_4>.
          super_QFlagsStorage<QLocalSocket::SocketOption>.i;
  pQVar1 = &this->connectingName;
  local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if ((uVar2 & 1) == 0) {
    cVar7 = QString::startsWith((QChar)(char16_t)pQVar1,0x2f);
    if (cVar7 != '\0') goto LAB_00247aa5;
    QDir::tempPath();
    qVar6 = qStack_b8;
    pcVar5 = pcStack_c0;
    pQVar12 = local_c8;
    qStack_b8 = 0;
    local_c8 = (QArrayData *)0x0;
    pcStack_c0 = (char16_t *)0x0;
    local_a8.a.a.d.d._0_2_ = SUB82(pQVar12,0);
    local_a8.a.a.d.d._2_2_ = (undefined2)((ulong)pQVar12 >> 0x10);
    local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar12 >> 0x20);
    local_a8.a.a.d.ptr._0_2_ = SUB82(pcVar5,0);
    local_a8.a.a.d.ptr._2_2_ = (undefined2)((ulong)pcVar5 >> 0x10);
    local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
    local_a8.a.a.d.size._0_2_ = (undefined2)qVar6;
    local_a8.a.a.d.size._2_2_ = (undefined2)((ulong)qVar6 >> 0x10);
    local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar6 >> 0x20);
    local_a8.a.b = L'/';
    local_a8.b._2_2_ = (undefined2)((ulong)pQVar1 >> 0x10);
    local_a8.b._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
    local_a8.b._0_2_ = (char16_t)pQVar1;
    QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&>::convertTo<QString>
              (&local_e8,&local_a8);
    piVar10 = (int *)CONCAT44(local_a8.a.a.d.d._4_4_,
                              CONCAT22(local_a8.a.a.d.d._2_2_,local_a8.a.a.d.d._0_2_));
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)
                   CONCAT44(local_a8.a.a.d.d._4_4_,
                            CONCAT22(local_a8.a.a.d.d._2_2_,local_a8.a.a.d.d._0_2_)),2,0x10);
      }
    }
    if (local_c8 != (QArrayData *)0x0) {
      LOCK();
      (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_c8,2,0x10);
      }
    }
  }
  else {
LAB_00247aa5:
    local_e8.d.d = (this->connectingName).d.d;
    local_e8.d.ptr = (this->connectingName).d.ptr;
    local_e8.d.size = (this->connectingName).d.size;
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_e8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_e8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = 0xaaaaaaaa;
  uStack_104 = 0xaaaaaaaa;
  uStack_100 = 0xaaaaaaaa;
  uStack_fc = 0xaaaaaaaa;
  QString::toLocal8Bit_helper((QChar *)&local_108,(longlong)local_e8.d.ptr);
  puVar4 = local_f8;
  local_a8.a.a.d.d._0_2_ = 1;
  local_a8.a.a.d.d._2_2_ = 0;
  local_a8.a.a.d.d._4_4_ = 0;
  local_a8.a.a.d.ptr._0_2_ = 0;
  local_a8.a.a.d.ptr._2_2_ = 0;
  local_a8.a.a.d.ptr._4_4_ = 0;
  local_a8.a.a.d.size._0_2_ = 0;
  local_a8.a.a.d.size._2_2_ = 0;
  local_a8.a.a.d.size._4_4_ = 0;
  local_a8.a.b = L'\0';
  local_a8.a._26_2_ = 0;
  local_a8.a._28_4_ = 0;
  local_a8.b._0_2_ = 0;
  local_a8.b._2_2_ = 0;
  local_a8.b._4_4_ = 0;
  uStack_80 = 0;
  uStack_7e = 0;
  uStack_7c = 0;
  local_78 = 0;
  uStack_76 = 0;
  uStack_74 = 0;
  uStack_70 = 0;
  uStack_6e = 0;
  uStack_6c = 0;
  local_68 = 0;
  uStack_66 = 0;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5e = 0;
  uStack_5c = 0;
  local_58 = 0;
  uStack_56 = 0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4e = 0;
  uStack_4c = 0;
  uStack_4a = 0;
  uStack_48 = 0;
  uStack_46 = 0;
  uStack_42 = 0;
  if (local_f8 + -0x6b < (undefined1 *)0xffffffffffffff93) {
    local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVar13.m_data = (storage_type *)0x1d;
    QVar13.m_size = (qsizetype)&local_c8;
    QString::fromLatin1(QVar13);
    local_128.d.d = (Data *)local_c8;
    local_128.d.ptr = pcStack_c0;
    local_128.d.size = qStack_b8;
    error = ServerNotFoundError;
    pQVar12 = local_c8;
  }
  else {
    if ((uVar2 & 1) == 0) {
      puVar11 = (undefined8 *)CONCAT44(uStack_fc,uStack_100);
      if (puVar11 == (undefined8 *)0x0) {
        puVar11 = &QByteArray::_empty;
      }
      __memcpy_chk((undefined1 *)((long)&local_a8.a.a.d.d + 2),puVar11,local_f8 + 1,0x6c);
      __len = 0x6e;
    }
    else {
      puVar11 = (undefined8 *)CONCAT44(uStack_fc,uStack_100);
      if (puVar11 == (undefined8 *)0x0) {
        puVar11 = &QByteArray::_empty;
      }
      __memcpy_chk((undefined1 *)((long)&local_a8.a.a.d.d + 3),puVar11,local_f8 + 1,0x6b);
      __len = (int)puVar4 + 3;
    }
    iVar3 = this->connectingSocket;
    do {
      iVar9 = connect(iVar3,(sockaddr *)&local_a8,__len);
      if (iVar9 != -1) {
        cancelDelayedConnect(this);
        QString::operator=(&this->serverName,(QString *)pQVar1);
        QString::operator=(&this->fullServerName,(QString *)&local_e8);
        bVar8 = QAbstractSocket::setSocketDescriptor
                          ((QAbstractSocket *)&this->unixSocket,(long)this->connectingSocket,
                           ConnectedState,
                           (OpenMode)
                           (this->connectingOpenMode).
                           super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                           super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
        if (bVar8) {
          QIODevice::open(this_00,(this->connectingOpenMode).
                                  super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                                  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
          QLocalSocket::connected((QLocalSocket *)this_00);
        }
        else {
          local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QVar14.m_data = (storage_type *)0x1d;
          QVar14.m_size = (qsizetype)&local_c8;
          QString::fromLatin1(QVar14);
          pQVar12 = local_c8;
          local_128.d.d = (Data *)local_c8;
          local_128.d.ptr = pcStack_c0;
          local_128.d.size = qStack_b8;
          setErrorAndEmit(this,UnknownSocketError,&local_128);
          if (pQVar12 != (QArrayData *)0x0) {
            LOCK();
            (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        this->connectingSocket = -1;
        if ((this->connectingName).d.ptr != (char16_t *)0x0) {
          pQVar12 = &((pQVar1->d).d)->super_QArrayData;
          (pQVar1->d).d = (Data *)0x0;
          (this->connectingName).d.ptr = (char16_t *)0x0;
          (this->connectingName).d.size = 0;
          if (pQVar12 != (QArrayData *)0x0) {
            LOCK();
            (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar12,2,0x10);
            }
          }
        }
        (this->connectingOpenMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
        super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = 0;
        goto LAB_00247e85;
      }
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
    local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVar15.m_data = (storage_type *)0x1d;
    QVar15.m_size = (qsizetype)&local_c8;
    QString::fromLatin1(QVar15);
    pQVar12 = local_c8;
    local_128.d.d = (Data *)local_c8;
    local_128.d.ptr = pcStack_c0;
    local_128.d.size = qStack_b8;
    piVar10 = __errno_location();
    iVar3 = *piVar10;
    if (iVar3 < 0xd) {
      if (iVar3 == 1) {
LAB_00248082:
        error = SocketAccessError;
      }
      else {
        if (iVar3 != 2) {
          if (iVar3 == 0xb) {
            if (this->delayConnect == (QSocketNotifier *)0x0) {
              this_01 = (QSocketNotifier *)operator_new(0x10);
              QSocketNotifier::QSocketNotifier(this_01,(long)this->connectingSocket,Write,this_00);
              this->delayConnect = this_01;
              QObject::connect(local_130,(char *)this_01,(QObject *)"2activated(QSocketDescriptor)",
                               (char *)this_00,0x2825ca);
              QMetaObject::Connection::~Connection((Connection *)local_130);
            }
            if (this->connectTimer == (QTimer *)0x0) {
              this_02 = (QTimer *)operator_new(0x10);
              QTimer::QTimer(this_02,this_00);
              this->connectTimer = this_02;
              QObject::connect(local_138,(char *)this_02,(QObject *)"2timeout()",(char *)this_00,
                               0x264dbf);
              QMetaObject::Connection::~Connection((Connection *)local_138);
              QTimer::start((int)this->connectTimer);
            }
            QSocketNotifier::setEnabled(SUB81(this->delayConnect,0));
            goto LAB_00247bcf;
          }
          goto LAB_00248094;
        }
        error = ServerNotFoundError;
      }
    }
    else if (iVar3 < 0x6e) {
      if (iVar3 == 0xd) goto LAB_00248082;
      if (iVar3 != 0x16) goto LAB_00248094;
LAB_00248073:
      error = ConnectionRefusedError;
    }
    else if (iVar3 == 0x6e) {
      error = SocketTimeoutError;
    }
    else {
      if (iVar3 == 0x6f) goto LAB_00248073;
LAB_00248094:
      error = UnknownSocketError;
    }
  }
  setErrorAndEmit(this,error,&local_128);
LAB_00247bcf:
  if (pQVar12 != (QArrayData *)0x0) {
    LOCK();
    (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00247e85:
  piVar10 = (int *)CONCAT44(uStack_104,local_108);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_104,local_108),1,0x10);
    }
  }
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalSocketPrivate::_q_connectToSocket()
{
    Q_Q(QLocalSocket);

    QLocalSocket::SocketOptions options = optionsForPlatform(socketOptions);
    const QString connectingPathName = pathNameForConnection(connectingName, options);
    const QByteArray encodedConnectingPathName = QFile::encodeName(connectingPathName);
    struct ::sockaddr_un addr;
    addr.sun_family = PF_UNIX;
    memset(addr.sun_path, 0, sizeof(addr.sun_path));

    // for abstract socket add 2 to length, to take into account trailing AND leading null
    constexpr unsigned int extraCharacters = PlatformSupportsAbstractNamespace ? 2 : 1;

    if (sizeof(addr.sun_path) < static_cast<size_t>(encodedConnectingPathName.size() + extraCharacters)) {
        QString function = "QLocalSocket::connectToServer"_L1;
        setErrorAndEmit(QLocalSocket::ServerNotFoundError, function);
        return;
    }

    QT_SOCKLEN_T addrSize = sizeof(::sockaddr_un);
    if (options.testFlag(QLocalSocket::AbstractNamespaceOption)) {
        ::memcpy(addr.sun_path + 1, encodedConnectingPathName.constData(),
                 encodedConnectingPathName.size() + 1);
        addrSize = offsetof(::sockaddr_un, sun_path) + encodedConnectingPathName.size() + 1;
    } else {
        ::memcpy(addr.sun_path, encodedConnectingPathName.constData(),
                 encodedConnectingPathName.size() + 1);
    }
    if (-1 == qt_safe_connect(connectingSocket, (struct sockaddr *)&addr, addrSize)) {
        QString function = "QLocalSocket::connectToServer"_L1;
        switch (errno)
        {
        case EINVAL:
        case ECONNREFUSED:
            setErrorAndEmit(QLocalSocket::ConnectionRefusedError, function);
            break;
        case ENOENT:
            setErrorAndEmit(QLocalSocket::ServerNotFoundError, function);
            break;
        case EACCES:
        case EPERM:
            setErrorAndEmit(QLocalSocket::SocketAccessError, function);
            break;
        case ETIMEDOUT:
            setErrorAndEmit(QLocalSocket::SocketTimeoutError, function);
            break;
        case EAGAIN:
            // Try again later, all of the sockets listening are full
            if (!delayConnect) {
                delayConnect = new QSocketNotifier(connectingSocket, QSocketNotifier::Write, q);
                q->connect(delayConnect, SIGNAL(activated(QSocketDescriptor)), q, SLOT(_q_connectToSocket()));
            }
            if (!connectTimer) {
                connectTimer = new QTimer(q);
                q->connect(connectTimer, SIGNAL(timeout()),
                                 q, SLOT(_q_abortConnectionAttempt()),
                                 Qt::DirectConnection);
                connectTimer->start(QT_CONNECT_TIMEOUT);
            }
            delayConnect->setEnabled(true);
            break;
        default:
            setErrorAndEmit(QLocalSocket::UnknownSocketError, function);
        }
        return;
    }

    // connected!
    cancelDelayedConnect();

    serverName = connectingName;
    fullServerName = connectingPathName;
    if (unixSocket.setSocketDescriptor(connectingSocket,
        QAbstractSocket::ConnectedState, connectingOpenMode)) {
        q->QIODevice::open(connectingOpenMode);
        q->emit connected();
    } else {
        QString function = "QLocalSocket::connectToServer"_L1;
        setErrorAndEmit(QLocalSocket::UnknownSocketError, function);
    }
    connectingSocket = -1;
    connectingName.clear();
    connectingOpenMode = { };
}